

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::Triangle::computeUnitNormal(Vector3d *__return_storage_ptr__,Triangle *this)

{
  Vector3d *this_00;
  Vector<double,_3U> local_30;
  
  this->HaveUnitNormal_ = true;
  cross<double>((Vector3<double> *)&local_30,&this->a_,&this->b_);
  this_00 = &this->unitnormal_;
  Vector<double,_3U>::operator=(&this_00->super_Vector<double,_3U>,&local_30);
  Vector<double,_3U>::normalize(&this_00->super_Vector<double,_3U>);
  Vector<double,_3U>::Vector
            (&__return_storage_ptr__->super_Vector<double,_3U>,&this_00->super_Vector<double,_3U>);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Triangle::computeUnitNormal() {
  HaveUnitNormal_ = true;
  unitnormal_     = cross(a_, b_);
  unitnormal_.normalize();
  return unitnormal_;
}